

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast_operators.hpp
# Opt level: O1

bool duckdb::DecimalCastOperation::TruncateExcessiveDecimals<duckdb::DecimalCastData<int>,false>
               (DecimalCastData<int> *state)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  
  uVar3 = (ulong)state->excessive_decimals;
  if (uVar3 == 0) {
    bVar1 = false;
  }
  else {
    iVar2 = state->result;
    do {
      iVar4 = iVar2;
      iVar2 = iVar4 / 10;
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
    state->result = iVar2;
    bVar1 = 4 < iVar4 % 10;
  }
  if ((state->exponent_type == POSITIVE) && (bVar1)) {
    state->result = state->result + 1;
  }
  state->decimal_count = state->scale;
  return true;
}

Assistant:

static bool TruncateExcessiveDecimals(T &state) {
		D_ASSERT(state.excessive_decimals);
		bool round_up = false;
		for (idx_t i = 0; i < state.excessive_decimals; i++) {
			auto mod = state.result % 10;
			round_up = NEGATIVE ? mod <= -5 : mod >= 5;
			state.result /= static_cast<typename T::StoreType>(10.0);
		}
		//! Only round up when exponents are involved
		if (state.exponent_type == ExponentType::POSITIVE && round_up) {
			RoundUpResult<T, NEGATIVE>(state);
		}
		D_ASSERT(state.decimal_count > state.scale);
		state.decimal_count = state.scale;
		return true;
	}